

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

string * quote_string(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_68;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  allocator local_39;
  undefined1 local_38 [8];
  string ans;
  string *s_local;
  
  ans.field_2._8_8_ = s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"\"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_68._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff98);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar3;
    if (cVar1 == '\t') {
      std::__cxx11::string::push_back((char)local_38);
      std::__cxx11::string::push_back((char)local_38);
    }
    else if (cVar1 == '\n') {
      std::__cxx11::string::push_back((char)local_38);
      std::__cxx11::string::push_back((char)local_38);
    }
    else if (cVar1 == '\f') {
      std::__cxx11::string::push_back((char)local_38);
      std::__cxx11::string::push_back((char)local_38);
    }
    else if ((cVar1 == '\"') || (cVar1 == '\\')) {
      std::__cxx11::string::push_back((char)local_38);
      std::__cxx11::string::push_back((char)local_38);
    }
    else {
      std::__cxx11::string::push_back((char)local_38);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,"\"")
  ;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string quote_string(const std::string &s)
{
    std::string ans = "\"";
    for(char c : s)
    {
        switch(c)
        {
            case '"':
            case '\\':
                ans.push_back('\\');
                ans.push_back(c);
                break;
            case '\n':
                ans.push_back('\\');
                ans.push_back('n');
                break;
            case '\t':
                ans.push_back('\\');
                ans.push_back('t');
                break;
            case '\f':
                ans.push_back('\\');
                ans.push_back('f');
                break;
            default:
                ans.push_back(c);
        }
    }
    return ans + "\"";
}